

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_coords.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  ChStreamOutAscii *pCVar136;
  int iVar137;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  double dVar280;
  double dVar281;
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  ChVector<double> mvect3;
  ChMatrix33<double> mrotA;
  ChFrameMoving<double> mframemovingB1;
  ChFrame<double> tempf;
  ChFrameMoving<double> mresg;
  ChFrame<double> tmp;
  ChFrameMoving<double> testPw;
  ChFrameMoving<double> bres;
  ChMatrix33<double> m32;
  ChMatrix33<double> m21;
  ChMatrix33<double> m10;
  ChFrameMoving<double> testX;
  ChFrame<double> mresf;
  undefined1 local_eb8 [8];
  double dStack_eb0;
  double local_ea8;
  ChVector<double> local_e98;
  ChVector<double> local_e78;
  ChVector<double> local_e58;
  undefined **local_e40;
  undefined1 local_e38 [16];
  double dStack_e28;
  double local_e18;
  double dStack_e10;
  double local_e08;
  ChMatrix33<double> local_e00;
  ChQuaternion<double> local_db8;
  ChMatrix33<double> local_d98;
  ChFrameMoving<double> local_d48;
  double local_c48;
  double local_c40;
  double local_c38;
  ChFrame<double> local_c30;
  ChFrame<double> local_ba8;
  ChFrame<double> local_b20;
  ChFrame<double> local_a98;
  ChFrame<double> local_a10;
  ChQuaternion<double> local_988;
  ChFrameMoving<double> local_960;
  ChFrameMoving<double> local_868;
  undefined1 local_770 [16];
  double dStack_760;
  double dStack_758;
  double dStack_750;
  double local_748;
  double dStack_740;
  double local_738;
  ChMatrix33<double> local_730;
  ChQuaternion<double> local_6e8;
  ChVector<double> local_6c8;
  ChVector<double> local_6a8;
  ChFrameMoving<double> local_688;
  ChCoordsys<double> local_588;
  ChQuaternion<double> local_550;
  ChQuaternion<double> local_530;
  ChFrame<double> local_510;
  ChFrameMoving<double> local_488;
  ChFrameMoving<double> local_388;
  ChMatrix33<double> local_288;
  ChMatrix33<double> local_240;
  ChMatrix33<double> local_1f8;
  ChFrameMoving<double> local_1b0;
  ChFrame<double> local_b8;
  
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar136,"Copyright (c) 2017 projectchrono.org\nChrono version: ");
  pCVar136 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar136,"7.0.0");
  chrono::ChStreamOutAscii::operator<<(pCVar136,"\n\n");
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar136,"CHRONO demo about coordinate transformations: \n\n");
  local_e78.m_data[0] = 0.0;
  local_e78.m_data[1] = 0.0;
  local_e78.m_data[2] = 0.0;
  local_eb8 = (undefined1  [8])0x4000000000000000;
  dStack_eb0 = 3.0;
  local_ea8 = 4.0;
  local_e58.m_data[0] = 5.0;
  local_e58.m_data[1] = 6.0;
  local_e58.m_data[2] = 7.0;
  local_db8.m_data[0] = 0.14002800840280097;
  local_db8.m_data[1] = 0.42008402520840293;
  local_db8.m_data[2] = 0.5601120336112039;
  local_db8.m_data[3] = 0.7001400420140048;
  chrono::ChMatrix33<double>::ChMatrix33(&local_d98,&local_db8);
  auVar282._8_8_ = 0;
  auVar282._0_8_ = local_ea8;
  local_588.pos.m_data[0] = 5.0;
  local_588.pos.m_data[1] = 6.0;
  local_588.pos.m_data[2] = 7.0;
  local_588.rot.m_data[0] = local_db8.m_data[0];
  local_588.rot.m_data[1] = local_db8.m_data[1];
  local_588.rot.m_data[2] = local_db8.m_data[2];
  local_588.rot.m_data[3] = local_db8.m_data[3];
  auVar142._8_8_ = 0;
  auVar142._0_8_ = local_eb8;
  auVar141._8_8_ = 0;
  auVar141._0_8_ =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar244._8_8_ = 0;
  auVar244._0_8_ =
       dStack_eb0 *
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar141 = vfmadd231sd_fma(auVar244,auVar142,auVar141);
  auVar139._8_8_ = 0;
  auVar139._0_8_ =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar324._8_8_ = 0;
  auVar324._0_8_ =
       dStack_eb0 *
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar139 = vfmadd231sd_fma(auVar324,auVar142,auVar139);
  auVar138._8_8_ = 0;
  auVar138._0_8_ =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar196._8_8_ = 0;
  auVar196._0_8_ =
       dStack_eb0 *
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar138 = vfmadd231sd_fma(auVar196,auVar142,auVar138);
  auVar140._8_8_ = 0;
  auVar140._0_8_ =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar138 = vfmadd231sd_fma(auVar138,auVar282,auVar140);
  auVar407._8_8_ = 0;
  auVar407._0_8_ =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar141 = vfmadd231sd_fma(auVar141,auVar282,auVar407);
  auVar409._8_8_ = 0;
  auVar409._0_8_ =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar139 = vfmadd231sd_fma(auVar139,auVar282,auVar409);
  local_e98.m_data[0] = auVar141._0_8_ + 5.0;
  local_e98.m_data[1] = auVar139._0_8_ + 6.0;
  local_e98.m_data[2] = auVar138._0_8_ + 7.0;
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,&local_e98);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..using linear algebra, \n");
  auVar407 = ZEXT816(0xbff0000000000000);
  auVar409 = ZEXT816(0x4000000000000000);
  auVar400._8_8_ = 0;
  auVar400._0_8_ = local_eb8;
  auVar404._8_8_ = 0;
  auVar404._0_8_ = local_ea8;
  dVar97 = local_db8.m_data[0] * local_db8.m_data[0];
  dVar281 = local_db8.m_data[1] * local_db8.m_data[2] - local_db8.m_data[0] * local_db8.m_data[3];
  dVar96 = local_db8.m_data[1] * local_db8.m_data[2] + local_db8.m_data[0] * local_db8.m_data[3];
  auVar357._8_8_ = 0;
  auVar357._0_8_ = dVar97 + local_db8.m_data[2] * local_db8.m_data[2];
  auVar141 = vfmadd213sd_fma(auVar357,auVar409,auVar407);
  auVar283._8_8_ = 0;
  auVar283._0_8_ = dVar97 + local_db8.m_data[1] * local_db8.m_data[1];
  auVar139 = vfmadd213sd_fma(auVar283,auVar409,auVar407);
  auVar372._8_8_ = 0;
  auVar372._0_8_ = dStack_eb0 * (dVar281 + dVar281);
  auVar139 = vfmadd231sd_fma(auVar372,auVar400,auVar139);
  dVar281 = local_db8.m_data[0] * local_db8.m_data[2] + local_db8.m_data[1] * local_db8.m_data[3];
  dVar98 = local_db8.m_data[1] * local_db8.m_data[3] - local_db8.m_data[0] * local_db8.m_data[2];
  auVar143._8_8_ = 0;
  auVar143._0_8_ = dVar96 + dVar96;
  auVar358._8_8_ = 0;
  auVar358._0_8_ = dStack_eb0 * auVar141._0_8_;
  auVar138 = vfmadd231sd_fma(auVar358,auVar400,auVar143);
  dVar99 = local_db8.m_data[2] * local_db8.m_data[3] - local_db8.m_data[0] * local_db8.m_data[1];
  dVar96 = local_db8.m_data[0] * local_db8.m_data[1] + local_db8.m_data[2] * local_db8.m_data[3];
  auVar284._8_8_ = 0;
  auVar284._0_8_ = dVar281 + dVar281;
  auVar141 = vfmadd213sd_fma(auVar284,auVar404,auVar139);
  auVar144._8_8_ = 0;
  auVar144._0_8_ = dVar99 + dVar99;
  auVar139 = vfmadd213sd_fma(auVar144,auVar404,auVar138);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = dVar98 + dVar98;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = dStack_eb0 * (dVar96 + dVar96);
  auVar140 = vfmadd231sd_fma(auVar325,auVar400,auVar197);
  auVar198._8_8_ = 0;
  auVar198._0_8_ = dVar97 + local_db8.m_data[3] * local_db8.m_data[3];
  auVar138 = vfmadd213sd_fma(auVar198,auVar409,auVar407);
  auVar138 = vfmadd213sd_fma(auVar138,auVar404,auVar140);
  local_c48 = local_e58.m_data[0];
  local_e98.m_data[0] = local_e58.m_data[0] + auVar141._0_8_;
  local_e98.m_data[1] = local_e58.m_data[1] + auVar139._0_8_;
  local_c40 = local_e58.m_data[1];
  local_e98.m_data[2] = local_e58.m_data[2] + auVar138._0_8_;
  local_c38 = local_e58.m_data[2];
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,&local_e98);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..using quaternion rotation, \n");
  auVar145._8_8_ = 0;
  auVar145._0_8_ = local_eb8;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = local_ea8;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar245._8_8_ = 0;
  auVar245._0_8_ =
       dStack_eb0 *
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar141 = vfmadd231sd_fma(auVar245,auVar145,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar326._8_8_ = 0;
  auVar326._0_8_ =
       dStack_eb0 *
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar139 = vfmadd231sd_fma(auVar326,auVar145,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar199._8_8_ = 0;
  auVar199._0_8_ =
       dStack_eb0 *
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar138 = vfmadd231sd_fma(auVar199,auVar145,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar141 = vfmadd231sd_fma(auVar141,auVar285,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar139 = vfmadd231sd_fma(auVar139,auVar285,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar138 = vfmadd231sd_fma(auVar138,auVar285,auVar6);
  local_e98.m_data[0] = auVar141._0_8_ + local_c48;
  local_e98.m_data[1] = auVar139._0_8_ + local_c40;
  local_e98.m_data[2] = auVar138._0_8_ + local_c38;
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,&local_e98);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..using the ChTransform- vect and rot.matrix, \n")
  ;
  chrono::ChTransform<double>::TransformLocalToParent
            ((ChVector<double> *)local_eb8,&local_e58,&local_db8);
  local_e98.m_data[0] = (double)local_d48.super_ChFrame<double>._vptr_ChFrame;
  local_e98.m_data[1] = local_d48.super_ChFrame<double>.coord.pos.m_data[0];
  local_e98.m_data[2] = local_d48.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,&local_e98);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..using the ChTransform- vect and quat, \n");
  chrono::ChCoordsys<double>::TransformLocalToParent(&local_588,(ChVector<double> *)local_eb8);
  local_e98.m_data[0] = (double)local_d48.super_ChFrame<double>._vptr_ChFrame;
  local_e98.m_data[1] = local_d48.super_ChFrame<double>.coord.pos.m_data[0];
  local_e98.m_data[2] = local_d48.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,&local_e98);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..using a ChChCoordsys<> object, \n");
  chrono::ChCoordsys<double>::TransformPointLocalToParent(&local_588,(ChVector<double> *)local_eb8);
  local_e98.m_data[0] = (double)local_d48.super_ChFrame<double>._vptr_ChFrame;
  local_e98.m_data[1] = local_d48.super_ChFrame<double>.coord.pos.m_data[0];
  local_e98.m_data[2] = local_d48.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,&local_e98);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..using a ChChCoordsys<> \'>>\' operator, \n");
  chrono::ChCoordsys<double>::TransformPointLocalToParent(&local_588,(ChVector<double> *)local_eb8);
  local_e98.m_data[0] = (double)local_d48.super_ChFrame<double>._vptr_ChFrame;
  local_e98.m_data[1] = local_d48.super_ChFrame<double>.coord.pos.m_data[0];
  local_e98.m_data[2] = local_d48.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,&local_e98);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..using a ChChCoordsys<> \'*\' operator, \n");
  auVar194._8_8_ = local_e58.m_data[2];
  auVar194._0_8_ = local_e58.m_data[2];
  auVar194._16_8_ = local_e58.m_data[2];
  auVar194._24_8_ = local_e58.m_data[2];
  local_e40 = &PTR__ChFrame_0011f7b8;
  auVar194 = vblendps_avx(ZEXT1632(CONCAT88(local_e58.m_data[1],local_e58.m_data[0])),auVar194,0x30)
  ;
  auVar242._8_8_ = local_db8.m_data[0];
  auVar242._0_8_ = local_db8.m_data[0];
  auVar242._16_8_ = local_db8.m_data[0];
  auVar242._24_8_ = local_db8.m_data[0];
  _local_e38 = vblendps_avx(auVar194,auVar242,0xc0);
  local_e18 = local_db8.m_data[1];
  dStack_e10 = local_db8.m_data[2];
  local_e08 = local_db8.m_data[3];
  chrono::ChMatrix33<double>::ChMatrix33(&local_e00,&local_db8);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = local_eb8;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = local_ea8;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar246._8_8_ = 0;
  auVar246._0_8_ =
       dStack_eb0 *
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar141 = vfmadd231sd_fma(auVar246,auVar146,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar327._8_8_ = 0;
  auVar327._0_8_ =
       dStack_eb0 *
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar139 = vfmadd231sd_fma(auVar327,auVar146,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar200._8_8_ = 0;
  auVar200._0_8_ =
       dStack_eb0 *
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar138 = vfmadd231sd_fma(auVar200,auVar146,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar141 = vfmadd231sd_fma(auVar141,auVar286,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar139 = vfmadd231sd_fma(auVar139,auVar286,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar138 = vfmadd231sd_fma(auVar138,auVar286,auVar12);
  local_e98.m_data[0] = auVar141._0_8_ + (double)local_e38._0_8_;
  local_e98.m_data[1] = auVar139._0_8_ + (double)local_e38._8_8_;
  local_e98.m_data[2] = auVar138._0_8_ + dStack_e28;
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,&local_e98);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..using a ChFrame object function, \n");
  auVar147._8_8_ = 0;
  auVar147._0_8_ = local_eb8;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = local_ea8;
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar247._8_8_ = 0;
  auVar247._0_8_ =
       dStack_eb0 *
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar141 = vfmadd231sd_fma(auVar247,auVar147,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar328._8_8_ = 0;
  auVar328._0_8_ =
       dStack_eb0 *
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar139 = vfmadd231sd_fma(auVar328,auVar147,auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar201._8_8_ = 0;
  auVar201._0_8_ =
       dStack_eb0 *
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar138 = vfmadd231sd_fma(auVar201,auVar147,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar141 = vfmadd231sd_fma(auVar141,auVar287,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar139 = vfmadd231sd_fma(auVar139,auVar287,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar138 = vfmadd231sd_fma(auVar138,auVar287,auVar18);
  local_e98.m_data[0] = auVar141._0_8_ + (double)local_e38._0_8_;
  local_e98.m_data[1] = auVar139._0_8_ + (double)local_e38._8_8_;
  local_e98.m_data[2] = auVar138._0_8_ + dStack_e28;
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,&local_e98);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..using a ChFrame \'>>\' operator, \n");
  auVar148._8_8_ = 0;
  auVar148._0_8_ = local_eb8;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = local_ea8;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar248._8_8_ = 0;
  auVar248._0_8_ =
       dStack_eb0 *
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar141 = vfmadd231sd_fma(auVar248,auVar148,auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar329._8_8_ = 0;
  auVar329._0_8_ =
       dStack_eb0 *
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar139 = vfmadd231sd_fma(auVar329,auVar148,auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar202._8_8_ = 0;
  auVar202._0_8_ =
       dStack_eb0 *
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar138 = vfmadd231sd_fma(auVar202,auVar148,auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar141 = vfmadd231sd_fma(auVar141,auVar288,auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar139 = vfmadd231sd_fma(auVar139,auVar288,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar138 = vfmadd231sd_fma(auVar138,auVar288,auVar24);
  local_e98.m_data[0] = auVar141._0_8_ + (double)local_e38._0_8_;
  local_e98.m_data[1] = auVar139._0_8_ + (double)local_e38._8_8_;
  local_e98.m_data[2] = auVar138._0_8_ + dStack_e28;
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,&local_e98);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..using a ChFrame \'*\' operator, \n");
  local_530.m_data[0] = 0.14002800840280097;
  local_530.m_data[1] = 0.42008402520840293;
  local_530.m_data[2] = 0.5601120336112039;
  local_530.m_data[3] = 0.7001400420140048;
  chrono::ChMatrix33<double>::ChMatrix33(&local_1f8,&local_530);
  local_550.m_data[0] = 0.48038446141526137;
  local_550.m_data[1] = 0.32025630761017426;
  local_550.m_data[2] = 0.16012815380508713;
  local_550.m_data[3] = 0.8006407690254357;
  chrono::ChMatrix33<double>::ChMatrix33(&local_240,&local_550);
  local_6e8.m_data[0] = 0.769800358919501;
  local_6e8.m_data[1] = 0.19245008972987526;
  local_6e8.m_data[2] = 0.5773502691896257;
  local_6e8.m_data[3] = 0.19245008972987526;
  chrono::ChMatrix33<double>::ChMatrix33(&local_288,&local_6e8);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = local_eb8;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = local_ea8;
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       local_288.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar330._8_8_ = 0;
  auVar330._0_8_ =
       dStack_eb0 *
       local_288.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar141 = vfmadd231sd_fma(auVar330,auVar149,auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       local_288.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar249._8_8_ = 0;
  auVar249._0_8_ =
       dStack_eb0 *
       local_288.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar139 = vfmadd231sd_fma(auVar249,auVar149,auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       local_288.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar203._8_8_ = 0;
  auVar203._0_8_ =
       dStack_eb0 *
       local_288.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar138 = vfmadd231sd_fma(auVar203,auVar149,auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       local_288.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar141 = vfmadd231sd_fma(auVar141,auVar289,auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       local_288.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar139 = vfmadd231sd_fma(auVar139,auVar289,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       local_288.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar138 = vfmadd231sd_fma(auVar138,auVar289,auVar30);
  dVar96 = auVar141._0_8_ + 5.0;
  dVar281 = auVar139._0_8_ + 1.0;
  dVar97 = auVar138._0_8_ + 1.0;
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar250._8_8_ = 0;
  auVar250._0_8_ = dVar281;
  auVar359._8_8_ = 0;
  auVar359._0_8_ =
       dVar96 * local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar141 = vfmadd231sd_fma(auVar359,auVar250,auVar31);
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar331._8_8_ = 0;
  auVar331._0_8_ =
       dVar96 * local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
  auVar139 = vfmadd231sd_fma(auVar331,auVar250,auVar32);
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar251._8_8_ = 0;
  auVar251._0_8_ = dVar281;
  auVar290._8_8_ = 0;
  auVar290._0_8_ =
       dVar96 * local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
  auVar138 = vfmadd231sd_fma(auVar290,auVar251,auVar33);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar204._8_8_ = 0;
  auVar204._0_8_ = dVar97;
  auVar141 = vfmadd231sd_fma(auVar141,auVar204,auVar34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar138 = vfmadd231sd_fma(auVar138,auVar204,auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar205._8_8_ = 0;
  auVar205._0_8_ = dVar97;
  auVar139 = vfmadd231sd_fma(auVar139,auVar205,auVar36);
  dVar96 = auVar139._0_8_ + 4.0;
  dVar281 = auVar138._0_8_ + 3.0;
  dVar97 = auVar141._0_8_ + 1.0;
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar206._8_8_ = 0;
  auVar206._0_8_ = dVar96;
  auVar291._8_8_ = 0;
  auVar291._0_8_ =
       dVar97 * local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
  auVar141 = vfmadd231sd_fma(auVar291,auVar206,auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar332._8_8_ = 0;
  auVar332._0_8_ =
       dVar97 * local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar139 = vfmadd231sd_fma(auVar332,auVar206,auVar38);
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar150._8_8_ = 0;
  auVar150._0_8_ =
       dVar97 * local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
  auVar207._8_8_ = 0;
  auVar207._0_8_ = dVar96;
  auVar138 = vfmadd231sd_fma(auVar150,auVar207,auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar252._8_8_ = 0;
  auVar252._0_8_ = dVar281;
  auVar138 = vfmadd231sd_fma(auVar138,auVar252,auVar40);
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar141 = vfmadd231sd_fma(auVar141,auVar252,auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar253._8_8_ = 0;
  auVar253._0_8_ = dVar281;
  auVar139 = vfmadd231sd_fma(auVar139,auVar253,auVar42);
  local_e78.m_data[1] = auVar139._0_8_ + 6.0;
  local_e78.m_data[2] = auVar138._0_8_ + 7.0;
  local_e78.m_data[0] = auVar141._0_8_ + 5.0;
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,&local_e78);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..triple trsf. using linear algebra, \n");
  local_c30._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0011f7b8;
  local_c30.coord.pos.m_data[0] = 5.0;
  local_c30.coord.pos.m_data[1] = 6.0;
  local_c30.coord.pos.m_data[2] = 7.0;
  local_c30.coord.rot.m_data[0] = local_530.m_data[0];
  local_c30.coord.rot.m_data[1] = local_530.m_data[1];
  local_c30.coord.rot.m_data[2] = local_530.m_data[2];
  local_c30.coord.rot.m_data[3] = local_530.m_data[3];
  chrono::ChMatrix33<double>::ChMatrix33(&local_c30.Amatrix,&local_530);
  local_ba8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0011f7b8;
  local_ba8.coord.pos.m_data[0] = 4.0;
  local_ba8.coord.pos.m_data[1] = 1.0;
  local_ba8.coord.pos.m_data[2] = 3.0;
  local_ba8.coord.rot.m_data[0] = local_550.m_data[0];
  local_ba8.coord.rot.m_data[1] = local_550.m_data[1];
  local_ba8.coord.rot.m_data[2] = local_550.m_data[2];
  local_ba8.coord.rot.m_data[3] = local_550.m_data[3];
  chrono::ChMatrix33<double>::ChMatrix33(&local_ba8.Amatrix,&local_550);
  local_b20._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0011f7b8;
  local_b20.coord.pos.m_data[0] = 1.0;
  local_b20.coord.pos.m_data[1] = 5.0;
  local_b20.coord.pos.m_data[2] = 1.0;
  local_b20.coord.rot.m_data[0] = local_6e8.m_data[0];
  local_b20.coord.rot.m_data[1] = local_6e8.m_data[1];
  local_b20.coord.rot.m_data[2] = local_6e8.m_data[2];
  local_b20.coord.rot.m_data[3] = local_6e8.m_data[3];
  chrono::ChMatrix33<double>::ChMatrix33(&local_b20.Amatrix,&local_6e8);
  auVar151._8_8_ = 0;
  auVar151._0_8_ = local_eb8;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = local_ea8;
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar333._8_8_ = 0;
  auVar333._0_8_ =
       dStack_eb0 *
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar141 = vfmadd231sd_fma(auVar333,auVar151,auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar254._8_8_ = 0;
  auVar254._0_8_ =
       dStack_eb0 *
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar139 = vfmadd231sd_fma(auVar254,auVar151,auVar44);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar208._8_8_ = 0;
  auVar208._0_8_ =
       dStack_eb0 *
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar138 = vfmadd231sd_fma(auVar208,auVar151,auVar45);
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar141 = vfmadd231sd_fma(auVar141,auVar292,auVar46);
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar139 = vfmadd231sd_fma(auVar139,auVar292,auVar47);
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar138 = vfmadd231sd_fma(auVar138,auVar292,auVar48);
  dVar96 = auVar141._0_8_ + local_b20.coord.pos.m_data[1];
  dVar281 = auVar139._0_8_ + local_b20.coord.pos.m_data[0];
  dVar97 = auVar138._0_8_ + local_b20.coord.pos.m_data[2];
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar255._8_8_ = 0;
  auVar255._0_8_ = dVar281;
  auVar293._8_8_ = 0;
  auVar293._0_8_ =
       dVar96 * local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar141 = vfmadd231sd_fma(auVar293,auVar255,auVar49);
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar209._8_8_ = 0;
  auVar209._0_8_ =
       dVar96 * local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
  auVar139 = vfmadd231sd_fma(auVar209,auVar255,auVar50);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar256._8_8_ = 0;
  auVar256._0_8_ = dVar281;
  auVar334._8_8_ = 0;
  auVar334._0_8_ =
       dVar96 * local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
  auVar138 = vfmadd231sd_fma(auVar334,auVar256,auVar51);
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar152._8_8_ = 0;
  auVar152._0_8_ = dVar97;
  auVar141 = vfmadd231sd_fma(auVar141,auVar152,auVar52);
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar139 = vfmadd231sd_fma(auVar139,auVar152,auVar53);
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar153._8_8_ = 0;
  auVar153._0_8_ = dVar97;
  auVar138 = vfmadd231sd_fma(auVar138,auVar153,auVar54);
  dVar96 = auVar141._0_8_ + local_ba8.coord.pos.m_data[1];
  dVar281 = auVar138._0_8_ + local_ba8.coord.pos.m_data[2];
  dVar97 = auVar139._0_8_ + local_ba8.coord.pos.m_data[0];
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar210._8_8_ = 0;
  auVar210._0_8_ = dVar97;
  auVar257._8_8_ = 0;
  auVar257._0_8_ =
       dVar96 * local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
  auVar141 = vfmadd231sd_fma(auVar257,auVar210,auVar55);
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar335._8_8_ = 0;
  auVar335._0_8_ =
       dVar96 * local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar139 = vfmadd231sd_fma(auVar335,auVar210,auVar56);
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar211._8_8_ = 0;
  auVar211._0_8_ = dVar97;
  auVar294._8_8_ = 0;
  auVar294._0_8_ =
       dVar96 * local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
  auVar138 = vfmadd231sd_fma(auVar294,auVar211,auVar57);
  auVar58._8_8_ = 0;
  auVar58._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar154._8_8_ = 0;
  auVar154._0_8_ = dVar281;
  auVar141 = vfmadd231sd_fma(auVar141,auVar154,auVar58);
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar139 = vfmadd231sd_fma(auVar139,auVar154,auVar59);
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar155._8_8_ = 0;
  auVar155._0_8_ = dVar281;
  auVar138 = vfmadd231sd_fma(auVar138,auVar155,auVar60);
  local_e78.m_data[0] = auVar141._0_8_ + local_c30.coord.pos.m_data[0];
  local_e78.m_data[1] = auVar139._0_8_ + local_c30.coord.pos.m_data[1];
  local_e78.m_data[2] = auVar138._0_8_ + local_c30.coord.pos.m_data[2];
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,&local_e78);
  chrono::ChStreamOutAscii::operator<<
            (pCVar136," ..triple vector trsf. with ChFrame \'>>\' operator, \n");
  chrono::ChFrame<double>::operator*(&local_868.super_ChFrame<double>,&local_c30,&local_ba8);
  chrono::ChFrame<double>::operator*
            (&local_d48.super_ChFrame<double>,&local_868.super_ChFrame<double>,&local_b20);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = local_eb8;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = local_ea8;
  auVar61._8_8_ = 0;
  auVar61._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar258._8_8_ = 0;
  auVar258._0_8_ =
       dStack_eb0 *
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar141 = vfmadd231sd_fma(auVar258,auVar156,auVar61);
  auVar62._8_8_ = 0;
  auVar62._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar336._8_8_ = 0;
  auVar336._0_8_ =
       dStack_eb0 *
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar139 = vfmadd231sd_fma(auVar336,auVar156,auVar62);
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar212._8_8_ = 0;
  auVar212._0_8_ =
       dStack_eb0 *
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar138 = vfmadd231sd_fma(auVar212,auVar156,auVar63);
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar141 = vfmadd231sd_fma(auVar141,auVar295,auVar64);
  auVar65._8_8_ = 0;
  auVar65._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar139 = vfmadd231sd_fma(auVar139,auVar295,auVar65);
  auVar66._8_8_ = 0;
  auVar66._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar138 = vfmadd231sd_fma(auVar138,auVar295,auVar66);
  local_e78.m_data[0] = auVar141._0_8_ + local_d48.super_ChFrame<double>.coord.pos.m_data[0];
  local_e78.m_data[1] = auVar139._0_8_ + local_d48.super_ChFrame<double>.coord.pos.m_data[1];
  local_e78.m_data[2] = auVar138._0_8_ + local_d48.super_ChFrame<double>.coord.pos.m_data[2];
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,&local_e78);
  chrono::ChStreamOutAscii::operator<<
            (pCVar136," ..triple vector trsf. with ChFrame \'*\' operator, \n");
  chrono::ChFrame<double>::operator*(&local_d48.super_ChFrame<double>,&local_c30,&local_ba8);
  chrono::ChFrame<double>::operator*(&local_a10,&local_d48.super_ChFrame<double>,&local_b20);
  auVar157._8_8_ = 0;
  auVar157._0_8_ = local_eb8;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = local_ea8;
  auVar67._8_8_ = 0;
  auVar67._0_8_ =
       local_a10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar259._8_8_ = 0;
  auVar259._0_8_ =
       dStack_eb0 *
       local_a10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar141 = vfmadd231sd_fma(auVar259,auVar157,auVar67);
  auVar68._8_8_ = 0;
  auVar68._0_8_ =
       local_a10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar337._8_8_ = 0;
  auVar337._0_8_ =
       dStack_eb0 *
       local_a10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar139 = vfmadd231sd_fma(auVar337,auVar157,auVar68);
  auVar69._8_8_ = 0;
  auVar69._0_8_ =
       local_a10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar213._8_8_ = 0;
  auVar213._0_8_ =
       dStack_eb0 *
       local_a10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar138 = vfmadd231sd_fma(auVar213,auVar157,auVar69);
  auVar70._8_8_ = 0;
  auVar70._0_8_ =
       local_a10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar141 = vfmadd231sd_fma(auVar141,auVar296,auVar70);
  auVar71._8_8_ = 0;
  auVar71._0_8_ =
       local_a10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar139 = vfmadd231sd_fma(auVar139,auVar296,auVar71);
  auVar72._8_8_ = 0;
  auVar72._0_8_ =
       local_a10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar138 = vfmadd231sd_fma(auVar138,auVar296,auVar72);
  local_e78.m_data[0] = auVar141._0_8_ + local_a10.coord.pos.m_data[0];
  local_e78.m_data[1] = auVar139._0_8_ + local_a10.coord.pos.m_data[1];
  local_e78.m_data[2] = auVar138._0_8_ + local_a10.coord.pos.m_data[2];
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,&local_e78);
  chrono::ChStreamOutAscii::operator<<
            (pCVar136," ..triple vector trsf. with ChFrame \'*\' operator, \n");
  local_d48.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_510._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0011f7b8;
  local_d48.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_d48.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_d48.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  local_510.coord.pos.m_data[0] = (double)local_eb8;
  local_510.coord.pos.m_data[1] = dStack_eb0;
  local_510.coord.pos.m_data[2] = local_ea8;
  local_510.coord.rot.m_data[0] = 1.0;
  local_510.coord.rot.m_data[1] = 0.0;
  local_510.coord.rot.m_data[2] = 0.0;
  local_510.coord.rot.m_data[3] = 0.0;
  chrono::ChMatrix33<double>::ChMatrix33(&local_510.Amatrix,(ChQuaternion<double> *)&local_d48);
  local_d48.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_a98._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0011f7b8;
  local_d48.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_d48.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_d48.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  local_a98.coord.pos.m_data[0] = 0.0;
  local_a98.coord.pos.m_data[1] = 0.0;
  local_a98.coord.pos.m_data[2] = 0.0;
  local_a98.coord.rot.m_data[0] = 1.0;
  local_a98.coord.rot.m_data[1] = 0.0;
  local_a98.coord.rot.m_data[2] = 0.0;
  local_a98.coord.rot.m_data[3] = 0.0;
  chrono::ChMatrix33<double>::ChMatrix33(&local_a98.Amatrix,(ChQuaternion<double> *)&local_d48);
  chrono::ChFrame<double>::operator>>(&local_960.super_ChFrame<double>,&local_510,&local_b20);
  chrono::ChFrame<double>::operator>>
            (&local_868.super_ChFrame<double>,&local_960.super_ChFrame<double>,&local_ba8);
  chrono::ChFrame<double>::operator>>
            (&local_d48.super_ChFrame<double>,&local_868.super_ChFrame<double>,&local_c30);
  local_a98.coord.pos.m_data[0] = local_d48.super_ChFrame<double>.coord.pos.m_data[0];
  local_a98.coord.pos.m_data[1] = local_d48.super_ChFrame<double>.coord.pos.m_data[1];
  local_a98.coord.pos.m_data[2] = local_d48.super_ChFrame<double>.coord.pos.m_data[2];
  local_a98.coord.rot.m_data[0] = local_d48.super_ChFrame<double>.coord.rot.m_data[0];
  local_a98.coord.rot.m_data[1] = local_d48.super_ChFrame<double>.coord.rot.m_data[1];
  local_a98.coord.rot.m_data[2] = local_d48.super_ChFrame<double>.coord.rot.m_data[2];
  local_a98.coord.rot.m_data[3] = local_d48.super_ChFrame<double>.coord.rot.m_data[3];
  local_a98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_a98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_a98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_a98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_a98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_a98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_a98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_a98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_a98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,&local_a98);
  chrono::ChStreamOutAscii::operator<<
            (pCVar136," ..triple frame trsf. with ChFrame \'>>\' operator,  \n");
  chrono::ChFrame<double>::operator*(&local_960.super_ChFrame<double>,&local_c30,&local_ba8);
  chrono::ChFrame<double>::operator*
            (&local_868.super_ChFrame<double>,&local_960.super_ChFrame<double>,&local_b20);
  chrono::ChFrame<double>::operator*
            (&local_d48.super_ChFrame<double>,&local_868.super_ChFrame<double>,&local_510);
  local_a98.coord.pos.m_data[0] = local_d48.super_ChFrame<double>.coord.pos.m_data[0];
  local_a98.coord.pos.m_data[1] = local_d48.super_ChFrame<double>.coord.pos.m_data[1];
  local_a98.coord.pos.m_data[2] = local_d48.super_ChFrame<double>.coord.pos.m_data[2];
  local_a98.coord.rot.m_data[0] = local_d48.super_ChFrame<double>.coord.rot.m_data[0];
  local_a98.coord.rot.m_data[1] = local_d48.super_ChFrame<double>.coord.rot.m_data[1];
  local_a98.coord.rot.m_data[2] = local_d48.super_ChFrame<double>.coord.rot.m_data[2];
  local_a98.coord.rot.m_data[3] = local_d48.super_ChFrame<double>.coord.rot.m_data[3];
  local_a98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_a98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_a98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_a98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_a98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_a98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_a98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_a98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_a98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,&local_a98);
  chrono::ChStreamOutAscii::operator<<
            (pCVar136," ..triple frame trsf. with ChFrame \'*\' operator,  \n");
  chrono::ChCoordsys<double>::TransformLocalToParent
            ((ChCoordsys<double> *)&local_960,&local_b20.coord,&local_510.coord);
  chrono::ChCoordsys<double>::TransformLocalToParent
            ((ChCoordsys<double> *)&local_868,&local_ba8.coord,(ChCoordsys<double> *)&local_960);
  chrono::ChCoordsys<double>::TransformLocalToParent
            ((ChCoordsys<double> *)&local_d48,&local_c30.coord,(ChCoordsys<double> *)&local_868);
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,&local_a98);
  chrono::ChStreamOutAscii::operator<<
            (pCVar136," ..triple frame trsf. with ChCoordsys \'>>\' operator,  \n");
  chrono::ChCoordsys<double>::TransformLocalToParent
            ((ChCoordsys<double> *)&local_960,&local_c30.coord,&local_ba8.coord);
  chrono::ChCoordsys<double>::TransformLocalToParent
            ((ChCoordsys<double> *)&local_868,(ChCoordsys<double> *)&local_960,&local_b20.coord);
  chrono::ChCoordsys<double>::TransformLocalToParent
            ((ChCoordsys<double> *)&local_d48,(ChCoordsys<double> *)&local_868,&local_510.coord);
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,&local_a98);
  chrono::ChStreamOutAscii::operator<<
            (pCVar136," ..triple frame trsf. with ChCoordsys \'*\' operator,  \n");
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,(ChVector<double> *)local_eb8);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..mvect1 \n");
  dVar96 = local_e98.m_data[1] - local_e58.m_data[1];
  dVar281 = local_e98.m_data[0] - local_e58.m_data[0];
  dVar97 = local_e98.m_data[2] - local_e58.m_data[2];
  auVar73._8_8_ = 0;
  auVar73._0_8_ =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar158._8_8_ = 0;
  auVar158._0_8_ = dVar281;
  auVar297._8_8_ = 0;
  auVar297._0_8_ =
       dVar96 * local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
  auVar141 = vfmadd231sd_fma(auVar297,auVar158,auVar73);
  auVar214._0_8_ =
       dVar96 * local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
  auVar214._8_8_ =
       dVar96 * local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar159._8_8_ = dVar281;
  auVar159._0_8_ = dVar281;
  auVar74._8_8_ = 0;
  auVar74._0_8_ =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar260._8_8_ = 0;
  auVar260._0_8_ = dVar97;
  auVar139 = vfmadd231sd_fma(auVar141,auVar260,auVar74);
  auVar114._8_8_ =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar114._0_8_ =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar141 = vfmadd132pd_fma(auVar159,auVar214,auVar114);
  auVar215._8_8_ = dVar97;
  auVar215._0_8_ = dVar97;
  auVar116._8_8_ =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar116._0_8_ =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  _local_eb8 = vfmadd132pd_fma(auVar215,auVar141,auVar116);
  local_ea8 = auVar139._0_8_;
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,(ChVector<double> *)local_eb8);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..inv, using linear algebra, \n");
  auVar298._8_8_ = 0;
  auVar298._0_8_ = local_db8.m_data[0];
  auVar407 = ZEXT816(0xbff0000000000000);
  auVar409 = ZEXT816(0x4000000000000000);
  dVar98 = local_e98.m_data[1] - local_e58.m_data[1];
  dVar97 = local_db8.m_data[0] * local_db8.m_data[0];
  auVar100._8_8_ = 0x8000000000000000;
  auVar100._0_8_ = 0x8000000000000000;
  auVar138 = vxorpd_avx512vl(auVar298,auVar100);
  auVar386._8_8_ = 0;
  auVar386._0_8_ = local_db8.m_data[2] * local_db8.m_data[2] + dVar97;
  auVar141 = vfmadd213sd_fma(auVar386,auVar409,auVar407);
  auVar373._8_8_ = 0;
  auVar373._0_8_ = dVar97 + local_db8.m_data[1] * local_db8.m_data[1];
  auVar139 = vfmadd213sd_fma(auVar373,auVar409,auVar407);
  dVar280 = auVar138._0_8_;
  dVar281 = local_db8.m_data[1] * local_db8.m_data[2] - local_db8.m_data[3] * dVar280;
  dVar96 = local_db8.m_data[1] * local_db8.m_data[2] + local_db8.m_data[3] * dVar280;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = local_e98.m_data[0] - local_e58.m_data[0];
  auVar299._8_8_ = 0;
  auVar299._0_8_ = dVar96 + dVar96;
  auVar387._8_8_ = 0;
  auVar387._0_8_ = auVar141._0_8_ * dVar98;
  auVar141 = vfmadd231sd_fma(auVar387,auVar160,auVar299);
  dVar99 = local_db8.m_data[3] * local_db8.m_data[2] - local_db8.m_data[1] * dVar280;
  dVar96 = local_db8.m_data[1] * dVar280 + local_db8.m_data[3] * local_db8.m_data[2];
  auVar395._8_8_ = 0;
  auVar395._0_8_ = (dVar281 + dVar281) * dVar98;
  auVar139 = vfmadd231sd_fma(auVar395,auVar160,auVar139);
  dVar281 = local_db8.m_data[2] * dVar280 + local_db8.m_data[3] * local_db8.m_data[1];
  dVar280 = local_db8.m_data[3] * local_db8.m_data[1] - local_db8.m_data[2] * dVar280;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = local_e98.m_data[2] - local_e58.m_data[2];
  auVar300._8_8_ = 0;
  auVar300._0_8_ = dVar99 + dVar99;
  auVar141 = vfmadd213sd_fma(auVar300,auVar261,auVar141);
  auVar161._8_8_ = 0;
  auVar161._0_8_ = local_e98.m_data[0] - local_e58.m_data[0];
  auVar216._8_8_ = 0;
  auVar216._0_8_ = dVar98 * (dVar96 + dVar96);
  auVar338._8_8_ = 0;
  auVar338._0_8_ = dVar280 + dVar280;
  auVar140 = vfmadd231sd_fma(auVar216,auVar161,auVar338);
  auVar374._8_8_ = 0;
  auVar374._0_8_ = dVar281 + dVar281;
  auVar139 = vfmadd213sd_fma(auVar374,auVar261,auVar139);
  auVar339._8_8_ = 0;
  auVar339._0_8_ = local_db8.m_data[3] * local_db8.m_data[3] + dVar97;
  auVar138 = vfmadd213sd_fma(auVar339,auVar409,auVar407);
  dStack_eb0 = (double)auVar141._0_8_;
  local_eb8 = (undefined1  [8])auVar139._0_8_;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = local_e98.m_data[2] - local_e58.m_data[2];
  auVar141 = vfmadd213sd_fma(auVar138,auVar262,auVar140);
  local_ea8 = auVar141._0_8_;
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,(ChVector<double> *)local_eb8);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..inv, using quaternion rotation, \n");
  dVar96 = local_e98.m_data[1] - local_e58.m_data[1];
  dVar281 = local_e98.m_data[0] - local_e58.m_data[0];
  dVar97 = local_e98.m_data[2] - local_e58.m_data[2];
  auVar75._8_8_ = 0;
  auVar75._0_8_ =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar162._8_8_ = 0;
  auVar162._0_8_ = dVar281;
  auVar301._8_8_ = 0;
  auVar301._0_8_ =
       dVar96 * local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
  auVar141 = vfmadd231sd_fma(auVar301,auVar162,auVar75);
  auVar217._0_8_ =
       dVar96 * local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
  auVar217._8_8_ =
       dVar96 * local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar163._8_8_ = dVar281;
  auVar163._0_8_ = dVar281;
  auVar76._8_8_ = 0;
  auVar76._0_8_ =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar263._8_8_ = 0;
  auVar263._0_8_ = dVar97;
  auVar139 = vfmadd231sd_fma(auVar141,auVar263,auVar76);
  auVar115._8_8_ =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar115._0_8_ =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar141 = vfmadd132pd_fma(auVar163,auVar217,auVar115);
  auVar218._8_8_ = dVar97;
  auVar218._0_8_ = dVar97;
  auVar117._8_8_ =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar117._0_8_ =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  _local_eb8 = vfmadd132pd_fma(auVar218,auVar141,auVar117);
  local_ea8 = auVar139._0_8_;
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,(ChVector<double> *)local_eb8);
  chrono::ChStreamOutAscii::operator<<
            (pCVar136," ..inv, using the ChTransform- vect and rot.matrix, \n");
  chrono::ChTransform<double>::TransformParentToLocal(&local_e98,&local_e58,&local_db8);
  local_eb8 = (undefined1  [8])local_d48.super_ChFrame<double>._vptr_ChFrame;
  dStack_eb0 = local_d48.super_ChFrame<double>.coord.pos.m_data[0];
  local_ea8 = local_d48.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,(ChVector<double> *)local_eb8);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..inv, using the ChTransform- vect and quat, \n");
  chrono::ChCoordsys<double>::TransformParentToLocal(&local_588,&local_e98);
  dStack_eb0 = local_d48.super_ChFrame<double>.coord.pos.m_data[0];
  local_eb8 = (undefined1  [8])local_d48.super_ChFrame<double>._vptr_ChFrame;
  local_ea8 = local_d48.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,(ChVector<double> *)local_eb8);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..inv, using a ChChCoordsys<> object, \n");
  dVar96 = local_e98.m_data[1] - (double)local_e38._8_8_;
  dVar281 = local_e98.m_data[0] - (double)local_e38._0_8_;
  dVar97 = local_e98.m_data[2] - dStack_e28;
  auVar77._8_8_ = 0;
  auVar77._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar164._8_8_ = 0;
  auVar164._0_8_ = dVar281;
  auVar302._8_8_ = 0;
  auVar302._0_8_ =
       dVar96 * local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
  auVar141 = vfmadd231sd_fma(auVar302,auVar164,auVar77);
  auVar219._0_8_ =
       dVar96 * local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
  auVar219._8_8_ =
       dVar96 * local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar165._8_8_ = dVar281;
  auVar165._0_8_ = dVar281;
  auVar78._8_8_ = 0;
  auVar78._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar264._8_8_ = 0;
  auVar264._0_8_ = dVar97;
  auVar139 = vfmadd231sd_fma(auVar141,auVar264,auVar78);
  auVar101._8_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar101._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar141 = vfmadd132pd_fma(auVar165,auVar219,auVar101);
  auVar220._8_8_ = dVar97;
  auVar220._0_8_ = dVar97;
  auVar109._8_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar109._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  _local_eb8 = vfmadd132pd_fma(auVar220,auVar141,auVar109);
  local_ea8 = auVar139._0_8_;
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,(ChVector<double> *)local_eb8);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..inv, using a ChFrame object function, \n");
  auVar166._8_8_ = 0;
  auVar166._0_8_ = local_e38._8_8_;
  auVar221._8_8_ = 0;
  auVar221._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar360._8_8_ = local_e38._0_8_;
  auVar360._0_8_ = local_e38._0_8_;
  auVar388._8_8_ = local_e98.m_data[0];
  auVar388._0_8_ = local_e98.m_data[0];
  auVar303._8_8_ = 0;
  auVar303._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar375._8_8_ = dStack_e28;
  auVar375._0_8_ = dStack_e28;
  auVar110._8_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar110._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar340._8_8_ = 0;
  auVar340._0_8_ =
       (double)local_e38._8_8_ *
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar141 = vfmadd231sd_fma(auVar340,auVar221,auVar360);
  auVar265._8_8_ = 0;
  auVar265._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_e98.m_data[1];
  auVar139 = vfmadd231sd_fma(auVar265,auVar388,auVar221);
  auVar222._8_8_ = local_e98.m_data[2];
  auVar222._0_8_ = local_e98.m_data[2];
  auVar141 = vfmadd231sd_fma(auVar141,auVar303,auVar375);
  auVar139 = vfmadd231sd_fma(auVar139,auVar222,auVar303);
  auVar102._8_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar102._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_ea8 = auVar139._0_8_ - auVar141._0_8_;
  auVar106._8_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar106._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar141 = vunpcklpd_avx(auVar106,auVar166);
  auVar341._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_e98.m_data[1];
  auVar341._8_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       local_e98.m_data[1];
  auVar167._0_8_ = auVar141._0_8_ * (double)local_e38._8_8_;
  auVar167._8_8_ =
       auVar141._8_8_ *
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar141 = vfmadd231pd_fma(auVar341,auVar102,auVar388);
  auVar139 = vfmadd231pd_fma(auVar167,auVar102,auVar360);
  auVar141 = vfmadd231pd_fma(auVar141,auVar110,auVar222);
  auVar139 = vfmadd231pd_fma(auVar139,auVar110,auVar375);
  _local_eb8 = vsubpd_avx(auVar141,auVar139);
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,(ChVector<double> *)local_eb8);
  chrono::ChStreamOutAscii::operator<<
            (pCVar136," ..inv, using a ChFrame inverse and \'>>\' operator, \n");
  auVar168._8_8_ = 0;
  auVar168._0_8_ = local_e38._8_8_;
  auVar223._8_8_ = 0;
  auVar223._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar361._8_8_ = local_e38._0_8_;
  auVar361._0_8_ = local_e38._0_8_;
  auVar389._8_8_ = local_e98.m_data[0];
  auVar389._0_8_ = local_e98.m_data[0];
  auVar304._8_8_ = 0;
  auVar304._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar376._8_8_ = dStack_e28;
  auVar376._0_8_ = dStack_e28;
  auVar111._8_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar111._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar342._8_8_ = 0;
  auVar342._0_8_ =
       (double)local_e38._8_8_ *
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar141 = vfmadd231sd_fma(auVar342,auVar223,auVar361);
  auVar266._8_8_ = 0;
  auVar266._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_e98.m_data[1];
  auVar139 = vfmadd231sd_fma(auVar266,auVar389,auVar223);
  auVar224._8_8_ = local_e98.m_data[2];
  auVar224._0_8_ = local_e98.m_data[2];
  auVar141 = vfmadd231sd_fma(auVar141,auVar304,auVar376);
  auVar139 = vfmadd231sd_fma(auVar139,auVar224,auVar304);
  auVar103._8_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar103._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_ea8 = auVar139._0_8_ - auVar141._0_8_;
  auVar107._8_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar107._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar141 = vunpcklpd_avx(auVar107,auVar168);
  auVar343._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_e98.m_data[1];
  auVar343._8_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       local_e98.m_data[1];
  auVar169._0_8_ = auVar141._0_8_ * (double)local_e38._8_8_;
  auVar169._8_8_ =
       auVar141._8_8_ *
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar141 = vfmadd231pd_fma(auVar343,auVar103,auVar389);
  auVar139 = vfmadd231pd_fma(auVar169,auVar103,auVar361);
  auVar141 = vfmadd231pd_fma(auVar141,auVar111,auVar224);
  auVar139 = vfmadd231pd_fma(auVar139,auVar111,auVar376);
  _local_eb8 = vsubpd_avx(auVar141,auVar139);
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,(ChVector<double> *)local_eb8);
  chrono::ChStreamOutAscii::operator<<
            (pCVar136," ..inv, using a ChFrame inverse and  \'*\' operator, \n");
  dVar96 = local_e98.m_data[1] - (double)local_e38._8_8_;
  dVar281 = local_e98.m_data[0] - (double)local_e38._0_8_;
  dVar97 = local_e98.m_data[2] - dStack_e28;
  auVar79._8_8_ = 0;
  auVar79._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar170._8_8_ = 0;
  auVar170._0_8_ = dVar281;
  auVar305._8_8_ = 0;
  auVar305._0_8_ =
       dVar96 * local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
  auVar141 = vfmadd231sd_fma(auVar305,auVar170,auVar79);
  auVar225._0_8_ =
       dVar96 * local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
  auVar225._8_8_ =
       dVar96 * local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar171._8_8_ = dVar281;
  auVar171._0_8_ = dVar281;
  auVar80._8_8_ = 0;
  auVar80._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar267._8_8_ = 0;
  auVar267._0_8_ = dVar97;
  auVar139 = vfmadd231sd_fma(auVar141,auVar267,auVar80);
  auVar104._8_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar104._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar141 = vfmadd132pd_fma(auVar171,auVar225,auVar104);
  auVar226._8_8_ = dVar97;
  auVar226._0_8_ = dVar97;
  auVar112._8_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar112._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  _local_eb8 = vfmadd132pd_fma(auVar226,auVar141,auVar112);
  local_ea8 = auVar139._0_8_;
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,(ChVector<double> *)local_eb8);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..inv, using a ChFrame \'/\' operator, \n");
  auVar172._8_8_ = 0;
  auVar172._0_8_ = local_e38._8_8_;
  auVar227._8_8_ = 0;
  auVar227._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar362._8_8_ = local_e38._0_8_;
  auVar362._0_8_ = local_e38._0_8_;
  auVar390._8_8_ = local_e98.m_data[0];
  auVar390._0_8_ = local_e98.m_data[0];
  auVar306._8_8_ = 0;
  auVar306._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar377._8_8_ = dStack_e28;
  auVar377._0_8_ = dStack_e28;
  auVar113._8_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar113._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar344._8_8_ = 0;
  auVar344._0_8_ =
       (double)local_e38._8_8_ *
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar141 = vfmadd231sd_fma(auVar344,auVar227,auVar362);
  auVar268._8_8_ = 0;
  auVar268._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_e98.m_data[1];
  auVar139 = vfmadd231sd_fma(auVar268,auVar390,auVar227);
  auVar228._8_8_ = local_e98.m_data[2];
  auVar228._0_8_ = local_e98.m_data[2];
  auVar141 = vfmadd231sd_fma(auVar141,auVar306,auVar377);
  auVar139 = vfmadd231sd_fma(auVar139,auVar228,auVar306);
  auVar105._8_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar105._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_ea8 = auVar139._0_8_ - auVar141._0_8_;
  auVar108._8_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar108._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar141 = vunpcklpd_avx(auVar108,auVar172);
  auVar345._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_e98.m_data[1];
  auVar345._8_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       local_e98.m_data[1];
  auVar173._0_8_ = auVar141._0_8_ * (double)local_e38._8_8_;
  auVar173._8_8_ =
       auVar141._8_8_ *
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar141 = vfmadd231pd_fma(auVar345,auVar105,auVar390);
  auVar139 = vfmadd231pd_fma(auVar173,auVar105,auVar362);
  auVar141 = vfmadd231pd_fma(auVar141,auVar113,auVar228);
  auVar139 = vfmadd231pd_fma(auVar139,auVar113,auVar377);
  _local_eb8 = vsubpd_avx(auVar141,auVar139);
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,(ChVector<double> *)local_eb8);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..inv, using an inverted ChFrame \n");
  chrono::ChFrame<double>::operator*(&local_868.super_ChFrame<double>,&local_c30,&local_ba8);
  chrono::ChFrame<double>::operator*
            (&local_d48.super_ChFrame<double>,&local_868.super_ChFrame<double>,&local_b20);
  auVar174._8_8_ = 0;
  auVar174._0_8_ = local_d48.super_ChFrame<double>.coord.pos.m_data[1];
  auVar229._8_8_ = 0;
  auVar229._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar363._8_8_ = local_d48.super_ChFrame<double>.coord.pos.m_data[0];
  auVar363._0_8_ = local_d48.super_ChFrame<double>.coord.pos.m_data[0];
  auVar391._8_8_ = local_e78.m_data[0];
  auVar391._0_8_ = local_e78.m_data[0];
  auVar307._8_8_ = 0;
  auVar307._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar378._8_8_ = local_d48.super_ChFrame<double>.coord.pos.m_data[2];
  auVar378._0_8_ = local_d48.super_ChFrame<double>.coord.pos.m_data[2];
  auVar122._8_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar122._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar346._8_8_ = 0;
  auVar346._0_8_ =
       local_d48.super_ChFrame<double>.coord.pos.m_data[1] *
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar141 = vfmadd231sd_fma(auVar346,auVar229,auVar363);
  auVar269._8_8_ = 0;
  auVar269._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_e78.m_data[1];
  auVar139 = vfmadd231sd_fma(auVar269,auVar391,auVar229);
  auVar230._8_8_ = local_e78.m_data[2];
  auVar230._0_8_ = local_e78.m_data[2];
  auVar141 = vfmadd231sd_fma(auVar141,auVar307,auVar378);
  auVar139 = vfmadd231sd_fma(auVar139,auVar230,auVar307);
  auVar118._8_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar118._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_ea8 = auVar139._0_8_ - auVar141._0_8_;
  auVar120._8_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar120._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar141 = vunpcklpd_avx(auVar120,auVar174);
  auVar347._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_e78.m_data[1];
  auVar347._8_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       local_e78.m_data[1];
  auVar175._0_8_ = auVar141._0_8_ * local_d48.super_ChFrame<double>.coord.pos.m_data[1];
  auVar175._8_8_ =
       auVar141._8_8_ *
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar141 = vfmadd231pd_fma(auVar347,auVar118,auVar391);
  auVar139 = vfmadd231pd_fma(auVar175,auVar118,auVar363);
  auVar141 = vfmadd231pd_fma(auVar141,auVar122,auVar230);
  auVar139 = vfmadd231pd_fma(auVar139,auVar122,auVar378);
  _local_eb8 = vsubpd_avx(auVar141,auVar139);
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,(ChVector<double> *)local_eb8);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..inv three transf \n");
  auVar348._8_8_ = local_b20.coord.pos.m_data[0];
  auVar348._0_8_ = local_b20.coord.pos.m_data[0];
  auVar364._8_8_ = local_b20.coord.pos.m_data[2];
  auVar364._0_8_ = local_b20.coord.pos.m_data[2];
  local_960.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0011f7b8;
  local_688.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0011f7b8;
  local_960.super_ChFrame<double>.coord.rot.m_data[0] = local_b20.coord.rot.m_data[0];
  local_960.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_960.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_960.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_960.super_ChFrame<double>.coord.rot.m_data[1] = -local_b20.coord.rot.m_data[1];
  local_960.super_ChFrame<double>.coord.rot.m_data[2] = -local_b20.coord.rot.m_data[2];
  auVar176._0_8_ = -local_b20.coord.rot.m_data[3];
  auVar176._8_8_ = 0x8000000000000000;
  local_960.super_ChFrame<double>.coord.rot.m_data[3] = (double)vmovlpd_avx(auVar176);
  auVar177._8_8_ = 0;
  auVar177._0_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar128._8_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar128._0_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar127._8_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar127._0_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar308._8_8_ = 0;
  auVar308._0_8_ =
       local_b20.coord.pos.m_data[1] *
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar141 = vfmadd231sd_fma(auVar308,auVar177,auVar348);
  auVar81._8_8_ = 0;
  auVar81._0_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar141 = vfmadd231sd_fma(auVar141,auVar364,auVar81);
  local_960.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)vmovlpd_avx(auVar128);
  auVar129._8_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar129._0_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_960.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_960.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_960.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar178._0_8_ =
       local_b20.coord.pos.m_data[1] *
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar178._8_8_ =
       local_b20.coord.pos.m_data[1] *
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar270._8_8_ = local_ba8.coord.pos.m_data[2];
  auVar270._0_8_ = local_ba8.coord.pos.m_data[2];
  auVar309._0_8_ = auVar141._0_8_ ^ 0x8000000000000000;
  auVar309._8_8_ = auVar141._8_8_ ^ 0x8000000000000000;
  auVar141 = vfmadd231pd_fma(auVar178,auVar127,auVar348);
  local_688.super_ChFrame<double>.coord.rot.m_data[1] = -local_ba8.coord.rot.m_data[1];
  local_688.super_ChFrame<double>.coord.rot.m_data[2] = -local_ba8.coord.rot.m_data[2];
  auVar141 = vfmadd231pd_fma(auVar141,auVar129,auVar364);
  local_960.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_960.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar231._8_8_ = local_ba8.coord.pos.m_data[0];
  auVar231._0_8_ = local_ba8.coord.pos.m_data[0];
  local_960.super_ChFrame<double>.coord.pos.m_data[0] = -auVar141._0_8_;
  local_960.super_ChFrame<double>.coord.pos.m_data[1] = -auVar141._8_8_;
  local_960.super_ChFrame<double>.coord.pos.m_data[2] = (double)vmovlpd_avx(auVar309);
  local_688.super_ChFrame<double>.coord.rot.m_data[0] = local_ba8.coord.rot.m_data[0];
  auVar310._0_8_ = -local_ba8.coord.rot.m_data[3];
  auVar310._8_8_ = 0x8000000000000000;
  local_688.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_688.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_688.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_688.super_ChFrame<double>.coord.rot.m_data[3] = (double)vmovlpd_avx(auVar310);
  auVar311._8_8_ = 0;
  auVar311._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar131._8_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar131._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar130._8_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar130._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar179._0_8_ =
       local_ba8.coord.pos.m_data[1] *
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar179._8_8_ =
       local_ba8.coord.pos.m_data[1] *
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar365._8_8_ = 0;
  auVar365._0_8_ =
       local_ba8.coord.pos.m_data[1] *
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar141 = vfmadd231sd_fma(auVar365,auVar311,auVar231);
  auVar82._8_8_ = 0;
  auVar82._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar139 = vfmadd231sd_fma(auVar141,auVar270,auVar82);
  local_688.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)vmovlpd_avx(auVar131);
  auVar141 = vfmadd231pd_fma(auVar179,auVar130,auVar231);
  auVar132._8_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar132._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar141 = vfmadd231pd_fma(auVar141,auVar132,auVar270);
  local_688.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_688.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_688.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar366._0_8_ = auVar139._0_8_ ^ 0x8000000000000000;
  auVar366._8_8_ = auVar139._8_8_ ^ 0x8000000000000000;
  local_688.super_ChFrame<double>.coord.pos.m_data[0] = -auVar141._0_8_;
  local_688.super_ChFrame<double>.coord.pos.m_data[1] = -auVar141._8_8_;
  local_688.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_688.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_688.super_ChFrame<double>.coord.pos.m_data[2] = (double)vmovlpd_avx(auVar366);
  chrono::ChFrame<double>::operator*
            (&local_868.super_ChFrame<double>,&local_960.super_ChFrame<double>,
             &local_688.super_ChFrame<double>);
  auVar349._8_8_ = local_c30.coord.pos.m_data[0];
  auVar349._0_8_ = local_c30.coord.pos.m_data[0];
  auVar367._8_8_ = local_c30.coord.pos.m_data[2];
  auVar367._0_8_ = local_c30.coord.pos.m_data[2];
  local_488.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0011f7b8;
  local_488.super_ChFrame<double>.coord.rot.m_data[0] = local_c30.coord.rot.m_data[0];
  local_488.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_488.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_488.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_488.super_ChFrame<double>.coord.rot.m_data[1] = -local_c30.coord.rot.m_data[1];
  local_488.super_ChFrame<double>.coord.rot.m_data[2] = -local_c30.coord.rot.m_data[2];
  auVar180._0_8_ = -local_c30.coord.rot.m_data[3];
  auVar180._8_8_ = 0x8000000000000000;
  local_488.super_ChFrame<double>.coord.rot.m_data[3] = (double)vmovlpd_avx(auVar180);
  auVar181._8_8_ = 0;
  auVar181._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar134._8_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar134._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar133._8_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar133._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar312._8_8_ = 0;
  auVar312._0_8_ =
       local_c30.coord.pos.m_data[1] *
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar141 = vfmadd231sd_fma(auVar312,auVar181,auVar349);
  auVar83._8_8_ = 0;
  auVar83._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar141 = vfmadd231sd_fma(auVar141,auVar367,auVar83);
  local_488.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)vmovlpd_avx(auVar134);
  auVar135._8_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar135._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_488.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_488.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_488.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar182._0_8_ =
       local_c30.coord.pos.m_data[1] *
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar182._8_8_ =
       local_c30.coord.pos.m_data[1] *
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar313._0_8_ = auVar141._0_8_ ^ 0x8000000000000000;
  auVar313._8_8_ = auVar141._8_8_ ^ 0x8000000000000000;
  auVar141 = vfmadd231pd_fma(auVar182,auVar133,auVar349);
  auVar141 = vfmadd231pd_fma(auVar141,auVar135,auVar367);
  local_488.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_488.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_488.super_ChFrame<double>.coord.pos.m_data[0] = -auVar141._0_8_;
  local_488.super_ChFrame<double>.coord.pos.m_data[1] = -auVar141._8_8_;
  local_488.super_ChFrame<double>.coord.pos.m_data[2] = (double)vmovlpd_avx(auVar313);
  chrono::ChFrame<double>::operator*
            (&local_d48.super_ChFrame<double>,&local_868.super_ChFrame<double>,
             &local_488.super_ChFrame<double>);
  auVar183._8_8_ = 0;
  auVar183._0_8_ = local_e78.m_data[0];
  auVar314._8_8_ = 0;
  auVar314._0_8_ = local_e78.m_data[2];
  auVar84._8_8_ = 0;
  auVar84._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar271._8_8_ = 0;
  auVar271._0_8_ =
       local_e78.m_data[1] *
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar141 = vfmadd231sd_fma(auVar271,auVar183,auVar84);
  auVar85._8_8_ = 0;
  auVar85._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar350._8_8_ = 0;
  auVar350._0_8_ =
       local_e78.m_data[1] *
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar139 = vfmadd231sd_fma(auVar350,auVar183,auVar85);
  auVar86._8_8_ = 0;
  auVar86._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar232._8_8_ = 0;
  auVar232._0_8_ =
       local_e78.m_data[1] *
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar138 = vfmadd231sd_fma(auVar232,auVar183,auVar86);
  auVar87._8_8_ = 0;
  auVar87._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar141 = vfmadd231sd_fma(auVar141,auVar314,auVar87);
  auVar88._8_8_ = 0;
  auVar88._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar139 = vfmadd231sd_fma(auVar139,auVar314,auVar88);
  auVar89._8_8_ = 0;
  auVar89._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar138 = vfmadd231sd_fma(auVar138,auVar314,auVar89);
  local_ea8 = auVar138._0_8_ + local_d48.super_ChFrame<double>.coord.pos.m_data[2];
  dStack_eb0 = auVar139._0_8_ + local_d48.super_ChFrame<double>.coord.pos.m_data[1];
  local_eb8 = (undefined1  [8])
              (auVar141._0_8_ + local_d48.super_ChFrame<double>.coord.pos.m_data[0]);
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,(ChVector<double> *)local_eb8);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..inv three transf (another method) \n");
  chrono::ChFrame<double>::operator>>(&local_868.super_ChFrame<double>,&local_b20,&local_ba8);
  chrono::ChFrame<double>::operator>>
            (&local_d48.super_ChFrame<double>,&local_868.super_ChFrame<double>,&local_c30);
  auVar184._8_8_ = 0;
  auVar184._0_8_ = local_d48.super_ChFrame<double>.coord.pos.m_data[1];
  auVar233._8_8_ = 0;
  auVar233._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar368._8_8_ = local_d48.super_ChFrame<double>.coord.pos.m_data[0];
  auVar368._0_8_ = local_d48.super_ChFrame<double>.coord.pos.m_data[0];
  auVar392._8_8_ = local_e78.m_data[0];
  auVar392._0_8_ = local_e78.m_data[0];
  auVar315._8_8_ = 0;
  auVar315._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar379._8_8_ = local_d48.super_ChFrame<double>.coord.pos.m_data[2];
  auVar379._0_8_ = local_d48.super_ChFrame<double>.coord.pos.m_data[2];
  auVar123._8_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar123._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar351._8_8_ = 0;
  auVar351._0_8_ =
       local_d48.super_ChFrame<double>.coord.pos.m_data[1] *
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar141 = vfmadd231sd_fma(auVar351,auVar233,auVar368);
  auVar272._8_8_ = 0;
  auVar272._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_e78.m_data[1];
  auVar139 = vfmadd231sd_fma(auVar272,auVar392,auVar233);
  auVar234._8_8_ = local_e78.m_data[2];
  auVar234._0_8_ = local_e78.m_data[2];
  auVar141 = vfmadd231sd_fma(auVar141,auVar315,auVar379);
  auVar139 = vfmadd231sd_fma(auVar139,auVar234,auVar315);
  auVar119._8_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar119._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_ea8 = auVar139._0_8_ - auVar141._0_8_;
  auVar121._8_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar121._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar141 = vunpcklpd_avx(auVar121,auVar184);
  auVar352._0_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_e78.m_data[1];
  auVar352._8_8_ =
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       local_e78.m_data[1];
  auVar185._0_8_ = auVar141._0_8_ * local_d48.super_ChFrame<double>.coord.pos.m_data[1];
  auVar185._8_8_ =
       auVar141._8_8_ *
       local_d48.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar141 = vfmadd231pd_fma(auVar352,auVar119,auVar392);
  auVar139 = vfmadd231pd_fma(auVar185,auVar119,auVar368);
  auVar141 = vfmadd231pd_fma(auVar141,auVar123,auVar234);
  auVar139 = vfmadd231pd_fma(auVar139,auVar123,auVar379);
  _local_eb8 = vsubpd_avx(auVar141,auVar139);
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,(ChVector<double> *)local_eb8);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..inv three transf (another method) \n");
  auVar186._8_8_ = 0;
  auVar186._0_8_ = local_c30.coord.pos.m_data[0];
  auVar316._8_8_ = 0;
  auVar316._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar353._8_8_ = 0;
  auVar353._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar369._8_8_ = 0;
  auVar369._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar273._8_8_ = 0;
  auVar273._0_8_ = local_c30.coord.pos.m_data[2];
  auVar396._8_8_ = 0;
  auVar396._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar398._8_8_ = 0;
  auVar398._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar401._8_8_ = 0;
  auVar401._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar408._8_8_ = 0;
  auVar408._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar402._8_8_ = 0;
  auVar402._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_c30.coord.pos.m_data[1];
  auVar141 = vfmadd231sd_fma(auVar402,auVar369,auVar186);
  auVar405._8_8_ = 0;
  auVar405._0_8_ =
       local_c30.coord.pos.m_data[1] *
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar139 = vfmadd231sd_fma(auVar405,auVar353,auVar186);
  auVar235._8_8_ = 0;
  auVar235._0_8_ =
       local_c30.coord.pos.m_data[1] *
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar138 = vfmadd231sd_fma(auVar235,auVar316,auVar186);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = local_e78.m_data[0];
  auVar141 = vfmadd231sd_fma(auVar141,auVar401,auVar273);
  auVar139 = vfmadd231sd_fma(auVar139,auVar398,auVar273);
  auVar138 = vfmadd231sd_fma(auVar138,auVar396,auVar273);
  auVar380._8_8_ = 0;
  auVar380._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_e78.m_data[1];
  auVar140 = vfmadd231sd_fma(auVar380,auVar187,auVar316);
  auVar317._8_8_ = 0;
  auVar317._0_8_ = local_e78.m_data[2];
  auVar140 = vfmadd231sd_fma(auVar140,auVar317,auVar396);
  dVar96 = auVar140._0_8_ - auVar138._0_8_;
  auVar384._8_8_ = 0;
  auVar384._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar393._8_8_ = 0;
  auVar393._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar274._8_8_ = 0;
  auVar274._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_e78.m_data[1];
  auVar138 = vfmadd231sd_fma(auVar274,auVar369,auVar187);
  auVar381._8_8_ = 0;
  auVar381._0_8_ =
       local_c30.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       local_e78.m_data[1];
  auVar140 = vfmadd231sd_fma(auVar381,auVar187,auVar353);
  auVar370._8_8_ = 0;
  auVar370._0_8_ = local_ba8.coord.pos.m_data[2];
  auVar140 = vfmadd231sd_fma(auVar140,auVar317,auVar398);
  auVar138 = vfmadd231sd_fma(auVar138,auVar401,auVar317);
  auVar318._8_8_ = 0;
  auVar318._0_8_ = local_ba8.coord.pos.m_data[1];
  auVar399._8_8_ = 0;
  auVar399._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  dVar281 = auVar140._0_8_ - auVar139._0_8_;
  dVar97 = auVar138._0_8_ - auVar141._0_8_;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = local_ba8.coord.pos.m_data[0];
  auVar382._8_8_ = 0;
  auVar382._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar403._8_8_ = 0;
  auVar403._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar406._8_8_ = 0;
  auVar406._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar139 = vmulsd_avx512f(auVar318,auVar399);
  auVar410._8_8_ = 0;
  auVar410._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_ba8.coord.pos.m_data[1];
  auVar141 = vfmadd231sd_fma(auVar410,auVar393,auVar275);
  auVar140 = vfmadd231sd_avx512f(auVar139,auVar384,auVar275);
  auVar319._8_8_ = 0;
  auVar319._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_ba8.coord.pos.m_data[1];
  auVar139 = vfmadd231sd_fma(auVar319,auVar382,auVar275);
  auVar397._8_8_ = local_b20.coord.pos.m_data[2];
  auVar397._0_8_ = local_b20.coord.pos.m_data[2];
  auVar236._8_8_ = 0;
  auVar236._0_8_ = dVar96;
  auVar276._8_8_ = 0;
  auVar276._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       dVar281;
  auVar138 = vfmadd231sd_fma(auVar276,auVar236,auVar382);
  auVar383._8_8_ = 0;
  auVar383._0_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar139 = vfmadd231sd_fma(auVar139,auVar403,auVar370);
  auVar141 = vfmadd231sd_fma(auVar141,auVar408,auVar370);
  auVar140 = vfmadd231sd_avx512f(auVar140,auVar406,auVar370);
  auVar188._8_8_ = 0;
  auVar188._0_8_ = dVar97;
  auVar138 = vfmadd231sd_fma(auVar138,auVar188,auVar403);
  dVar98 = auVar138._0_8_ - auVar139._0_8_;
  auVar124._8_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar124._0_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar354._8_8_ = 0;
  auVar354._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       dVar281;
  auVar139 = vfmadd231sd_fma(auVar354,auVar393,auVar236);
  auVar237._8_8_ = 0;
  auVar237._0_8_ = dVar96;
  auVar320._8_8_ = 0;
  auVar320._0_8_ =
       local_ba8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       dVar281;
  auVar138 = vfmadd231sd_fma(auVar320,auVar237,auVar384);
  auVar238._8_8_ = 0;
  auVar238._0_8_ = local_b20.coord.pos.m_data[1];
  auVar394._8_8_ = local_b20.coord.pos.m_data[0];
  auVar394._0_8_ = local_b20.coord.pos.m_data[0];
  auVar139 = vfmadd231sd_fma(auVar139,auVar408,auVar188);
  auVar189._8_8_ = 0;
  auVar189._0_8_ = dVar97;
  auVar138 = vfmadd231sd_fma(auVar138,auVar189,auVar406);
  dVar96 = auVar139._0_8_ - auVar141._0_8_;
  auVar355._8_8_ = 0;
  auVar355._0_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar141 = vsubsd_avx512f(auVar138,auVar140);
  dVar281 = auVar141._0_8_;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = dVar98;
  auVar371._8_8_ = 0;
  auVar371._0_8_ =
       dVar281 * local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar141 = vfmadd231sd_fma(auVar371,auVar277,auVar355);
  auVar385._8_8_ = 0;
  auVar385._0_8_ =
       local_b20.coord.pos.m_data[1] *
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar139 = vfmadd231sd_fma(auVar385,auVar355,auVar394);
  auVar278._8_8_ = dVar98;
  auVar278._0_8_ = dVar98;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = dVar96;
  auVar141 = vfmadd231sd_fma(auVar141,auVar190,auVar383);
  auVar139 = vfmadd231sd_fma(auVar139,auVar383,auVar397);
  auVar125._8_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar125._0_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar191._8_8_ = dVar96;
  auVar191._0_8_ = dVar96;
  local_ea8 = auVar141._0_8_ - auVar139._0_8_;
  auVar126._8_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar126._0_8_ =
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar141 = vunpcklpd_avx(auVar125,auVar238);
  auVar321._0_8_ =
       dVar281 * local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar321._8_8_ =
       dVar281 * local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
  auVar239._0_8_ = auVar141._0_8_ * local_b20.coord.pos.m_data[1];
  auVar239._8_8_ =
       auVar141._8_8_ *
       local_b20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar141 = vfmadd213pd_fma(auVar278,auVar124,auVar321);
  auVar139 = vfmadd231pd_fma(auVar239,auVar124,auVar394);
  auVar141 = vfmadd213pd_fma(auVar191,auVar126,auVar141);
  auVar139 = vfmadd231pd_fma(auVar139,auVar126,auVar397);
  _local_eb8 = vsubpd_avx(auVar141,auVar139);
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,(ChVector<double> *)local_eb8);
  chrono::ChStreamOutAscii::operator<<(pCVar136," ..inv three transf (another method) \n");
  auVar195._8_8_ = local_e58.m_data[2];
  auVar195._0_8_ = local_e58.m_data[2];
  auVar195._16_8_ = local_e58.m_data[2];
  auVar195._24_8_ = local_e58.m_data[2];
  local_770._0_8_ = &PTR__ChFrame_0011f7b8;
  auVar194 = vblendpd_avx(ZEXT1632(CONCAT88(local_e58.m_data[1],local_e58.m_data[0])),auVar195,4);
  auVar243._8_8_ = local_db8.m_data[0];
  auVar243._0_8_ = local_db8.m_data[0];
  auVar243._16_8_ = local_db8.m_data[0];
  auVar243._24_8_ = local_db8.m_data[0];
  unique0x000eb980 = vblendpd_avx(auVar194,auVar243,8);
  local_748 = local_db8.m_data[1];
  dStack_740 = local_db8.m_data[2];
  local_738 = local_db8.m_data[3];
  chrono::ChMatrix33<double>::ChMatrix33(&local_730,&local_db8);
  chrono::ChFrameMoving<double>::ChFrameMoving(&local_d48,&local_e58,&local_db8);
  chrono::operator*(&local_b8,&local_d48,(ChFrame<double> *)local_770);
  chrono::operator*(&local_868,(ChFrame<double> *)local_770,&local_d48);
  chrono::ChFrame<double>::ConcatenatePreTransformation((ChFrame<double> *)local_770,&local_c30);
  auVar194 = stack0xfffffffffffff898;
  dStack_760 = dStack_760 + 2.0;
  local_770._8_8_ = (double)local_770._8_8_ + 1.0;
  dStack_758 = auVar194._16_8_;
  dStack_750 = auVar194._24_8_;
  dStack_758 = dStack_758 + 3.0;
  chrono::Q_from_AngAxis(0.5235987755982988,(ChVector *)&local_960);
  chrono::ChFrame<double>::operator>>=
            ((ChFrame<double> *)local_770,(ChQuaternion<double> *)&local_960);
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar136," %%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%% \n\n");
  auVar138 = ZEXT816(0xbff0000000000000);
  auVar139 = ZEXT816(0x4000000000000000);
  dVar96 = local_db8.m_data[0] * local_db8.m_data[0];
  auVar322._8_8_ = 0;
  auVar322._0_8_ = dVar96 + local_db8.m_data[1] * local_db8.m_data[1];
  auVar141 = vfmadd213sd_fma(auVar322,auVar139,auVar138);
  local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar141._0_8_;
  local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_db8.m_data[1] * local_db8.m_data[2] - local_db8.m_data[0] * local_db8.m_data[3];
  local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_db8.m_data[1] * local_db8.m_data[2] + local_db8.m_data[0] * local_db8.m_data[3];
  local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] +
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] +
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_db8.m_data[0] * local_db8.m_data[2] + local_db8.m_data[1] * local_db8.m_data[3];
  local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] +
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar192._8_8_ = 0;
  auVar192._0_8_ = dVar96 + local_db8.m_data[2] * local_db8.m_data[2];
  auVar141 = vfmadd213sd_fma(auVar192,auVar139,auVar138);
  local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar141._0_8_;
  local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_db8.m_data[2] * local_db8.m_data[3] - local_db8.m_data[0] * local_db8.m_data[1];
  local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] +
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_db8.m_data[1] * local_db8.m_data[3] - local_db8.m_data[0] * local_db8.m_data[2];
  local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] +
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar240._8_8_ = 0;
  auVar240._0_8_ = dVar96 + local_db8.m_data[3] * local_db8.m_data[3];
  auVar141 = vfmadd213sd_fma(auVar240,auVar139,auVar138);
  local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_db8.m_data[0] * local_db8.m_data[1] + local_db8.m_data[2] * local_db8.m_data[3];
  local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] +
       local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_d98.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar141._0_8_;
  chrono::ChFrameMoving<double>::ChFrameMoving(&local_960,&local_e58,&local_db8);
  local_960.coord_dt.pos.m_data[0] = 0.5;
  local_960.coord_dt.pos.m_data[1] = 0.6;
  local_960.coord_dt.pos.m_data[2] = 0.7;
  local_688.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff199999999999a;
  local_688.super_ChFrame<double>.coord.pos.m_data[0] = 2.1;
  local_688.super_ChFrame<double>.coord.pos.m_data[1] = 5.1;
  chrono::ChFrameMoving<double>::SetWvel_loc(&local_960,(ChVector<double> *)&local_688);
  local_960.coord_dtdt.pos.m_data[0] = 7.0;
  local_960.coord_dtdt.pos.m_data[1] = 8.0;
  local_688.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x4011333333333333;
  local_688.super_ChFrame<double>.coord.pos.m_data[0] = 5.3;
  local_960.coord_dtdt.pos.m_data[2] = 9.0;
  local_688.super_ChFrame<double>.coord.pos.m_data[1] = 2.3;
  chrono::ChFrameMoving<double>::SetWacc_loc(&local_960,(ChVector<double> *)&local_688);
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,&local_960);
  chrono::ChStreamOutAscii::operator<<(pCVar136,"a moving frame");
  local_6c8.m_data[0] = 0.1;
  local_6c8.m_data[1] = 3.1;
  local_6c8.m_data[2] = 1.1;
  chrono::ChFrameMoving<double>::ChFrameMoving
            (&local_688,&local_6c8,(ChQuaternion<double> *)&chrono::QUNIT);
  local_688.coord_dt.pos.m_data[0] = 3.2;
  local_688.coord_dt.pos.m_data[1] = 9.2;
  local_688.coord_dt.pos.m_data[2] = 7.2;
  local_488.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3fd999999999999a;
  local_488.super_ChFrame<double>.coord.pos.m_data[0] = 0.5;
  local_688.coord_dt.rot.m_data[0] = local_db8.m_data[0];
  local_688.coord_dt.rot.m_data[1] = local_db8.m_data[1];
  local_688.coord_dt.rot.m_data[2] = local_db8.m_data[2];
  local_688.coord_dt.rot.m_data[3] = local_db8.m_data[3];
  local_488.super_ChFrame<double>.coord.pos.m_data[1] = 0.6;
  chrono::ChFrameMoving<double>::SetWvel_loc(&local_688,(ChVector<double> *)&local_488);
  local_688.coord_dtdt.pos.m_data[0] = 5.3;
  local_688.coord_dtdt.pos.m_data[1] = 3.3;
  local_488.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3fdb851eb851eb85;
  local_488.super_ChFrame<double>.coord.pos.m_data[0] = 0.53;
  local_688.coord_dtdt.pos.m_data[2] = 2.3;
  local_488.super_ChFrame<double>.coord.pos.m_data[1] = 0.63;
  chrono::ChFrameMoving<double>::SetWacc_loc(&local_688,(ChVector<double> *)&local_488);
  local_1b0.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_388.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_388.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x0;
  local_388.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_1b0.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_1b0.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_1b0.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  chrono::ChFrameMoving<double>::ChFrameMoving
            (&local_488,(ChVector<double> *)&local_388,(ChQuaternion<double> *)&local_1b0);
  local_388.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_988.m_data[2] = 0.0;
  local_988.m_data[0] = 0.0;
  local_988.m_data[1] = 0.0;
  local_388.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_388.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_388.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  chrono::ChFrameMoving<double>::ChFrameMoving
            (&local_1b0,(ChVector<double> *)&local_988,(ChQuaternion<double> *)&local_388);
  chrono::ChFrameMoving<double>::TransformLocalToParent(&local_960,&local_688,&local_488);
  local_988.m_data[0] = 1.0;
  local_6a8.m_data[2] = 0.0;
  local_6a8.m_data[0] = 0.0;
  local_6a8.m_data[1] = 0.0;
  local_988.m_data[1] = 0.0;
  local_988.m_data[2] = 0.0;
  local_988.m_data[3] = 0.0;
  chrono::ChFrameMoving<double>::ChFrameMoving(&local_388,&local_6a8,&local_988);
  chrono::ChFrameMoving<double>::TransformLocalToParent(&local_960,&local_688,&local_388);
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = chrono::operator<<(pCVar136,&local_388);
  chrono::ChStreamOutAscii::operator<<(pCVar136," trasf loc->abs \n");
  std::chrono::_V2::system_clock::now();
  iVar137 = 1000000;
  do {
    chrono::ChFrameMoving<double>::TransformLocalToParent(&local_960,&local_688,&local_488);
    iVar137 = iVar137 + -1;
  } while (iVar137 != 0);
  std::chrono::_V2::system_clock::now();
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar136,"TEST 10e6 of ChFrameMoving::TransformLocalToParent (1.38) Time: ")
  ;
  pCVar136 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar136,NAN);
  chrono::ChStreamOutAscii::operator<<(pCVar136," \n");
  std::chrono::_V2::system_clock::now();
  auVar193._8_8_ = 0;
  auVar193._0_8_ = local_eb8;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = local_ea8;
  auVar90._8_8_ = 0;
  auVar90._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar279._8_8_ = 0;
  auVar279._0_8_ =
       dStack_eb0 *
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar141 = vfmadd231sd_fma(auVar279,auVar193,auVar90);
  auVar91._8_8_ = 0;
  auVar91._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar356._8_8_ = 0;
  auVar356._0_8_ =
       dStack_eb0 *
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar139 = vfmadd231sd_fma(auVar356,auVar193,auVar91);
  auVar92._8_8_ = 0;
  auVar92._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar241._8_8_ = 0;
  auVar241._0_8_ =
       dStack_eb0 *
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar138 = vfmadd231sd_fma(auVar241,auVar193,auVar92);
  auVar93._8_8_ = 0;
  auVar93._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar141 = vfmadd231sd_fma(auVar141,auVar323,auVar93);
  auVar94._8_8_ = 0;
  auVar94._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar139 = vfmadd231sd_fma(auVar139,auVar323,auVar94);
  auVar95._8_8_ = 0;
  auVar95._0_8_ =
       local_e00.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar138 = vfmadd231sd_fma(auVar138,auVar323,auVar95);
  local_e98.m_data[0] = auVar141._0_8_ + (double)local_e38._0_8_;
  local_e98.m_data[1] = auVar139._0_8_ + (double)local_e38._8_8_;
  local_e98.m_data[2] = auVar138._0_8_ + dStack_e28;
  std::chrono::_V2::system_clock::now();
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar136,"TEST 10e6 of mvect2 = mvect1 >> mframeA; (0.03)");
  pCVar136 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar136,NAN);
  chrono::ChStreamOutAscii::operator<<(pCVar136," \n");
  std::chrono::_V2::system_clock::now();
  iVar137 = 1000000;
  do {
    chrono::ChFrameMoving<double>::PointAccelerationParentToLocal
              ((ChVector<double> *)&local_988,&local_960,&local_e58,&local_e58,&local_e58);
    iVar137 = iVar137 + -1;
  } while (iVar137 != 0);
  std::chrono::_V2::system_clock::now();
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar136 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar136,"TEST 10e6 of PointAccelerationParentToLocal (0.811)");
  pCVar136 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar136,NAN);
  chrono::ChStreamOutAscii::operator<<(pCVar136," \n");
  pCVar136 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar136,"\n  CHRONO execution terminated.");
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    GetLog() << "Copyright (c) 2017 projectchrono.org\nChrono version: " << CHRONO_VERSION << "\n\n";

    // To write something to the console, use the chrono::GetLog()
    GetLog() << "CHRONO demo about coordinate transformations: \n\n";

    //
    // Some methods to achieve coordinate transformations, and some
    // examples of how to manipulate coordinates and frames, using Chrono features.
    //
    // You can use ChTransform or ChChCoordsys<> or ChFrame functions to transform points
    // from/to local coordinates in 3D, in ascending complexity and capabilities.
    //

    ChVector<> mvect2;  // resulting (transformed) vectors will go here
    ChVector<> mvect3;

    // Define a  POINT  to be transformed, expressed in
    // local frame coordinate.
    ChVector<> mvect1(2, 3, 4);

    // Define a vector representing the TRANSLATION of the frame
    // respect to absolute (world) coordinates.
    ChVector<> vtraslA(5, 6, 7);

    // Define a quaternion representing the ROTATION of the frame
    // respect to absolute (world) coordinates. Must be normalized.
    ChQuaternion<> qrotA(1, 3, 4, 5);
    qrotA.Normalize();

    // ..Also create a 3x3 rotation matrix [A] from the quaternion
    // (at any time you can use mrotA.Set_A_quaternion(qrotA) );
    ChMatrix33<> mrotA(qrotA);

    // ..Also create a ChCoordsys<>tem object, representing both
    // translation and rotation.
    ChCoordsys<> csysA(vtraslA, qrotA);

    // OK!!! Now we are ready to perform the transformation, like in
    // linear algebra formula v'=t+[A]*v, so that we will obtain
    // the coordinates of mvect1 in absolute coordinates.
    // This can be achieved in many ways. Let's see them.

    // TRANSFORM USING ROTATION MATRIX AND LINEAR ALGEBRA
    //
    mvect2 = vtraslA + mrotA * mvect1;  // like:  v2 = t + [A]*v1
    GetLog() << mvect2 << " ..using linear algebra, \n";

    // TRANSFORM USING QUATERNION ROTATION

    mvect2 = vtraslA + qrotA.Rotate(mvect1);
    GetLog() << mvect2 << " ..using quaternion rotation, \n";

    // TRANSFORM USING THE ChTransform STATIC METHODS

    mvect2 = ChTransform<>::TransformLocalToParent(mvect1, vtraslA, mrotA);
    GetLog() << mvect2 << " ..using the ChTransform- vect and rot.matrix, \n";

    mvect2 = ChTransform<>::TransformLocalToParent(mvect1, vtraslA, qrotA);
    GetLog() << mvect2 << " ..using the ChTransform- vect and quat, \n";

    // TRANSFORM USING A ChCoordys OBJECT

    mvect2 = csysA.TransformLocalToParent(mvect1);
    GetLog() << mvect2 << " ..using a ChChCoordsys<> object, \n";

    mvect2 = mvect1 >> csysA;
    GetLog() << mvect2 << " ..using a ChChCoordsys<> '>>' operator, \n";

    mvect2 = csysA * mvect1;
    GetLog() << mvect2 << " ..using a ChChCoordsys<> '*' operator, \n";

    // TRANSFORM USING A ChFrame OBJECT

    ChFrame<> mframeA(vtraslA, qrotA);  // or ChFrame<> mframeA(csysA);

    mvect2 = mframeA.TransformLocalToParent(mvect1);
    GetLog() << mvect2 << " ..using a ChFrame object function, \n";

    mvect2 = mvect1 >> mframeA;
    GetLog() << mvect2 << " ..using a ChFrame '>>' operator, \n";

    mvect2 = mframeA * mvect1;
    GetLog() << mvect2 << " ..using a ChFrame '*' operator, \n";

    //
    // Now perform transformations in a chain of frames, in
    // sequence.
    //

    ChVector<> v10(5, 6, 7);
    ChQuaternion<> q10(1, 3, 4, 5);
    q10.Normalize();
    ChMatrix33<> m10(q10);

    ChVector<> v21(4, 1, 3);
    ChQuaternion<> q21(3, 2, 1, 5);
    q21.Normalize();
    ChMatrix33<> m21(q21);

    ChVector<> v32(1, 5, 1);
    ChQuaternion<> q32(4, 1, 3, 1);
    q32.Normalize();
    ChMatrix33<> m32(q32);

    // ...with linear algebra:

    mvect3 = v10 + m10 * (v21 + m21 * (v32 + m32 * mvect1));
    GetLog() << mvect3 << " ..triple trsf. using linear algebra, \n";

    // ...with ChFrame '>>' operator or "*" operator
    // is by far much simplier!

    ChFrame<> f10(v10, q10);
    ChFrame<> f21(v21, q21);
    ChFrame<> f32(v32, q32);

    mvect3 = mvect1 >> f32 >> f21 >> f10;
    GetLog() << mvect3 << " ..triple vector trsf. with ChFrame '>>' operator, \n";

    mvect3 = f10 * f21 * f32 * mvect1;
    GetLog() << mvect3 << " ..triple vector trsf. with ChFrame '*' operator, \n";

    ChFrame<> tempf(f10 * f21 * f32);
    mvect3 = tempf * mvect1;
    GetLog() << mvect3 << " ..triple vector trsf. with ChFrame '*' operator, \n";

    // Not only vectors, but also ChFrame can be transformed
    // with ">>" or "*" operators.

    ChFrame<> f_3(mvect1);
    ChFrame<> f_0;
    f_0 = f_3 >> f32 >> f21 >> f10;
    GetLog() << f_0 << " ..triple frame trsf. with ChFrame '>>' operator,  \n";

    f_0 = f10 * f21 * f32 * f_3;
    GetLog() << f_0 << " ..triple frame trsf. with ChFrame '*' operator,  \n";

    // Test the  ">>" or "*" operators also for ChCoordsys:
    ChCoordsys<> c_0;
    c_0 = f_3.GetCoord() >> f32.GetCoord() >> f21.GetCoord() >> f10.GetCoord();
    GetLog() << f_0 << " ..triple frame trsf. with ChCoordsys '>>' operator,  \n";

    c_0 = f10.GetCoord() * f21.GetCoord() * f32.GetCoord() * f_3.GetCoord();
    GetLog() << f_0 << " ..triple frame trsf. with ChCoordsys '*' operator,  \n";

    //
    // Now test inverse transformations too.
    //
    // From the low-level to the higher level methods, here are some
    // ways to accomplish this.
    //

    // TRANSFORM USING ROTATION MATRIX AND LINEAR ALGEBRA
    //

    GetLog() << mvect1 << " ..mvect1 \n";
    mvect1 = mrotA.transpose() * (mvect2 - vtraslA);  // like:  v1 = [A]'*(v2-t)
    GetLog() << mvect1 << " ..inv, using linear algebra, \n";

    // TRANSFORM USING QUATERNION ROTATION

    mvect1 = qrotA.RotateBack(mvect2 - vtraslA);
    GetLog() << mvect1 << " ..inv, using quaternion rotation, \n";

    // TRANSFORM USING THE ChTransform STATIC METHODS

    mvect1 = ChTransform<>::TransformParentToLocal(mvect2, vtraslA, mrotA);
    GetLog() << mvect1 << " ..inv, using the ChTransform- vect and rot.matrix, \n";

    mvect1 = ChTransform<>::TransformParentToLocal(mvect2, vtraslA, qrotA);
    GetLog() << mvect1 << " ..inv, using the ChTransform- vect and quat, \n";

    // TRANSFORM USING A ChCoordys OBJECT

    mvect1 = csysA.TransformParentToLocal(mvect2);
    GetLog() << mvect1 << " ..inv, using a ChChCoordsys<> object, \n";

    // TRANSFORM USING A ChFrame OBJECT

    mvect1 = mframeA.TransformParentToLocal(mvect2);
    GetLog() << mvect1 << " ..inv, using a ChFrame object function, \n";

    mvect1 = mvect2 >> mframeA.GetInverse();
    GetLog() << mvect1 << " ..inv, using a ChFrame inverse and '>>' operator, \n";

    mvect1 = mframeA.GetInverse() * mvect2;
    GetLog() << mvect1 << " ..inv, using a ChFrame inverse and  '*' operator, \n";

    mvect1 = mframeA / mvect2;
    GetLog() << mvect1 << " ..inv, using a ChFrame '/' operator, \n";

    ChFrame<> mframeAinv(mframeA);
    mframeAinv.Invert();
    mvect1 = mframeAinv * mvect2;
    GetLog() << mvect1 << " ..inv, using an inverted ChFrame \n";

    // ... also for inverting chain of transformations...

    // mvect3 =  f10 * f21 * f32 * mvect1;				// direct transf..

    mvect1 = (f10 * f21 * f32).GetInverse() * mvect3;  // inverse transf.
    GetLog() << mvect1 << " ..inv three transf \n";

    mvect1 = f32.GetInverse() * f21.GetInverse() * f10.GetInverse() * mvect3;
    GetLog() << mvect1 << " ..inv three transf (another method) \n";

    mvect1 = mvect3 >> (f32 >> f21 >> f10).GetInverse();
    GetLog() << mvect1 << " ..inv three transf (another method) \n";

    mvect1 = mvect3 >> f10.GetInverse() >> f21.GetInverse() >> f32.GetInverse();
    GetLog() << mvect1 << " ..inv three transf (another method) \n";

    //
    // Now test the * and >> operators with some mixed-types operators
    //

    ChFrame<> mframeA1(vtraslA, qrotA);
    ChFrameMoving<> mframemovingB1(vtraslA, qrotA);
    ChFrame<> mresf = mframemovingB1 * mframeA1;
    ChFrameMoving<> mresg = mframeA1 * mframemovingB1;

    //
    // Test some in-place operators, even with mixed-types. Some examples.
    //

    // Transform mframeA1 by rotating & translating by another frame,
    // using the in-place >>= operator, as in  A >>= B,
    // that means:   frameA' = frameA >> frameB  = frameB * frameA
    mframeA1 >>= f10;

    // Transform mframeA1 by translating by a vector:
    mframeA1 >>= ChVector<>(1, 2, 3);

    // Transform mframeA1 by rotating it 30 degrees on axis Y, using a quaternion:
    mframeA1 >>= Q_from_AngAxis(30 * CH_C_DEG_TO_RAD, VECT_Y);

    //
    // BENCHMARK FOR EXECUTION SPEED
    //

    GetLog() << " %%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%% \n\n";

    mrotA.Set_A_quaternion(qrotA);
    ChFpMatrix34<> Fp(qrotA);
    ChFmMatrix34<> Fm(qrotA);
    ChGlMatrix34<> Gl(qrotA);
    ChGwMatrix34<> Gw(qrotA);

    ChFrameMoving<> testa(vtraslA, qrotA);
    testa.SetPos_dt(ChVector<>(0.5, 0.6, 0.7));
    testa.SetWvel_loc(ChVector<>(1.1, 2.1, 5.1));
    testa.SetPos_dtdt(ChVector<>(7, 8, 9));
    testa.SetWacc_loc(ChVector<>(4.3, 5.3, 2.3));
    GetLog() << testa << "a moving frame";

    ChVector<> locpos(0.1, 3.1, 1.1);
    ChVector<> locspeed(3.2, 9.2, 7.2);
    ChVector<> locacc(5.3, 3.3, 2.3);

    ChFrameMoving<> testPl(locpos, QUNIT);
    testPl.SetPos_dt(locspeed);
    testPl.SetRot_dt(qrotA);
    testPl.SetWvel_loc(ChVector<>(0.4, 0.5, 0.6));
    testPl.SetPos_dtdt(locacc);
    testPl.SetWacc_loc(ChVector<>(0.43, 0.53, 0.63));
    ChFrameMoving<> testPw;
    ChFrameMoving<> testX;
    testa.TransformLocalToParent(testPl, testPw);

    ChFrameMoving<> bres = (testPl >> testa);

    GetLog() << bres << " trasf loc->abs \n";

    ChQuaternion<> pollo(3, 5, 6, 7);
    ChVector<> pallo(2, 4, 6);

    ChTimer<double> timer;

    //int numcycles = 100000;
    int i;

    timer.start();
    for (i = 0; i < 1000000; i++) {
        testa.TransformLocalToParent(testPl, testPw);
    }
    timer.stop();
    GetLog() << "TEST 10e6 of ChFrameMoving::TransformLocalToParent (1.38) Time: " << timer() << " \n";
    // VC6   : 1.380
    // VC2003: 0.861
    // VC2005: 0.691
    // GCC   : 0.661

    timer.start();
    for (i = 0; i < 1000000; i++) {
        mvect2 = mvect1 >> mframeA;
    }
    timer.stop();
    GetLog() << "TEST 10e6 of mvect2 = mvect1 >> mframeA; (0.03)" << timer() << " \n";
    // VC6   : 0.03
    // VC2003: 0.03
    // VC2005: 0.03
    // GCC   : 0.03

    timer.start();
    for (i = 0; i < 1000000; i++) {
        testa.PointAccelerationParentToLocal(vtraslA, vtraslA, vtraslA);
    }
    timer.stop();
    GetLog() << "TEST 10e6 of PointAccelerationParentToLocal (0.811)" << timer() << " \n";
    // VC6   : 0.811
    // VC2003: 0.531
    // VC2005: 0.410
    // GCC   : 0.320

    /*
       timer.start();
       for (i= 0; i<numcycles; i++)
       {
           for (int j = 0; j<100; j++)
           {
               mvect2 = mvect1 >> f32 >> f21 >> f10;
               // NOTE: thank to the fact that operators are executed from left to
               // right, the above is MUCH faster (16x) than the equivalent:
               //    mvect2 =  f10 * f21 * f32 * mvect1;
               // because the latter, if no parenthesis are used, would imply
               // three expensive frame*frame operations, and a last frame*vector.
           }
       }
       timer.stop();
       GetLog() << "Test 3 frame transf. with >> ChFrame operator: " <<  timer() << " \n";


       timer.start();
       for (i= 0; i<1000000; i++)
       {
           testa.SetCoord(vtraslA,qrotA);
       }
       timer.stop();
       GetLog() << "Test ChFrame::SetPos() " <<  timer() << " \n";


   //ChQuaternion<> mqdt(1, 2, 3, 4);
       timer.start();
       for (i= 0; i<1000000; i++)
       {
           testa.SetRot_dt(mqdt);
       }
       timer.stop();
       GetLog() << "Test ChFrame::SetRot_dt() " <<  timer() << " \n";

       timer.start();
       for (i= 0; i<1000000; i++)
       {
           testa.SetRot_dtdt(mqdt);
       }
       timer.stop()
       GetLog() << "Test ChFrame::SetRot_dtdt() " <<  timer() << " \n";


   ChVector<> mv(1, 2, 3);
       timer.start();
       for (i= 0; i<1000000; i++)
       {
           testa.SetWvel_loc(mv);
       }
       timer.stop();
       GetLog() << "Test ChFrame::SetWvel_loc() " <<  timer() << " \n";

       timer.start();
       for (i= 0; i<1000000; i++)
       {
           testa.SetWacc_loc(mv);
       }
       timer.stop();
       GetLog() << "Test ChFrame::SetWacc_loc() " <<  timer() << " \n";

       timer.start();
       for (i= 0; i<1000000; i++)
       {
           Vector p= testa.GetWvel_loc();
       }
       timer.stop();
       GetLog() << "Test ChFrame::GetWvel_loc() " <<  timer() << " \n";

       timer.start();
       for (i= 0; i<1000000; i++)
       {
           ChVector<> p= testa.GetWacc_loc();
       }
       timer.stop();
       GetLog() << "Test ChFrame::GetWacc_loc() " <<  timer() << " \n";


   */

    GetLog() << "\n  CHRONO execution terminated.";

    return 0;
}